

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O0

AffineSpace3fa * embree::fromQuaternionDecomposition(RTCQuaternionDecomposition *qdc)

{
  float fVar1;
  float *in_RSI;
  AffineSpace3fa *in_RDI;
  Quaternion3f q;
  AffineSpace3fa S;
  AffineSpace3fa T;
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  undefined8 local_2578;
  undefined8 uStack_2570;
  float local_2498;
  float local_1ff8;
  float fStack_1ff4;
  float fStack_1ff0;
  float fStack_1fec;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1448;
  undefined8 uStack_1440;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  
  fVar1 = *in_RSI;
  local_808 = (float)local_25a8;
  fStack_804 = (float)((ulong)local_25a8 >> 0x20);
  fStack_800 = (float)uStack_25a0;
  fStack_7fc = (float)((ulong)uStack_25a0 >> 0x20);
  local_868 = (float)local_1ad8;
  fStack_864 = (float)((ulong)local_1ad8 >> 0x20);
  fStack_860 = (float)uStack_1ad0;
  fStack_85c = (float)((ulong)uStack_1ad0 >> 0x20);
  local_11c8 = (float)local_1448;
  fStack_11c4 = (float)((ulong)local_1448 >> 0x20);
  fStack_11c0 = (float)uStack_1440;
  fStack_11bc = (float)((ulong)uStack_1440 >> 0x20);
  local_1ff8 = (float)local_2578;
  fStack_1ff4 = (float)((ulong)local_2578 >> 0x20);
  fStack_1ff0 = (float)uStack_2570;
  fStack_1fec = (float)((ulong)uStack_2570 >> 0x20);
  *(ulong *)&(in_RDI->l).vx.field_0 =
       CONCAT44(fVar1 * fStack_804 + fStack_864,fVar1 * local_808 + local_868);
  *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8) =
       CONCAT44(fVar1 * fStack_7fc + fStack_85c,fVar1 * fStack_800 + fStack_860);
  *(undefined8 *)&(in_RDI->l).vy.field_0 = local_1de8;
  *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_1de0;
  *(undefined8 *)&(in_RDI->l).vz.field_0 = local_1df8;
  *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_1df0;
  *(ulong *)&(in_RDI->p).field_0 =
       CONCAT44(local_2498 * fStack_804 + fStack_11c4 + fStack_1ff4,
                local_2498 * local_808 + local_11c8 + local_1ff8);
  *(ulong *)((long)&(in_RDI->p).field_0 + 8) =
       CONCAT44(local_2498 * fStack_7fc + fStack_11bc + fStack_1fec,
                local_2498 * fStack_800 + fStack_11c0 + fStack_1ff0);
  return in_RDI;
}

Assistant:

AffineSpace3fa fromQuaternionDecomposition(const RTCQuaternionDecomposition& qdc)
{
  AffineSpace3fa T = AffineSpace3fa::scale(Vec3fa(1.f, 1.f, 1.f));
  T.p = Vec3fa(qdc.translation_x, qdc.translation_y, qdc.translation_z);

  AffineSpace3fa S = AffineSpace3fa::scale(Vec3fa(1.f, 1.f, 1.f));
  S.l.vx.x = qdc.scale_x; S.l.vy.x = qdc.skew_xy; S.l.vz.x = qdc.skew_xz; S.p.x = qdc.shift_x;
                          S.l.vy.y = qdc.scale_y; S.l.vz.y = qdc.skew_yz; S.p.y = qdc.shift_y;
                                                  S.l.vz.z = qdc.scale_z; S.p.z = qdc.shift_z;

  Quaternion3f q = Quaternion3f(Vec4f(
    qdc.quaternion_r, qdc.quaternion_i, qdc.quaternion_j, qdc.quaternion_k));

  AffineSpace3fa R = AffineSpace3fa(LinearSpace3fa(q));
  return T * R * S;
}